

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i2p_stream.hpp
# Opt level: O1

void __thiscall
libtorrent::i2p_connection::
on_name_lookup<std::_Bind<void(libtorrent::aux::http_connection::*(std::shared_ptr<libtorrent::aux::http_connection>,std::_Placeholder<1>,std::_Placeholder<2>))(boost::system::error_code_const&,char_const*)>>
          (i2p_connection *this,error_code *ec,shared_ptr<libtorrent::i2p_stream> *param_2,
          _Bind<void_(libtorrent::aux::http_connection::*(std::shared_ptr<libtorrent::aux::http_connection>,_std::_Placeholder<1>,_std::_Placeholder<2>))(const_boost::system::error_code_&,_const_char_*)>
          *handler)

{
  list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_boost::system::error_code_&,_const_char_*)>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_boost::system::error_code_&,_const_char_*)>_>_>_>
  *this_00;
  element_type *peVar1;
  pointer pcVar2;
  _List_node_base *p_Var3;
  _List_node_base *p_Var4;
  code *pcVar5;
  long *plVar6;
  string name;
  _Any_data local_68;
  _List_node_base *local_58;
  _List_node_base *local_50;
  long *local_48 [2];
  long local_38 [2];
  
  this->m_state = sam_idle;
  peVar1 = (this->m_sam_socket).
           super___shared_ptr<libtorrent::i2p_stream,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  pcVar2 = (peVar1->m_name_lookup)._M_dataplus._M_p;
  local_48[0] = local_38;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)local_48,pcVar2,pcVar2 + (peVar1->m_name_lookup)._M_string_length);
  this_00 = &this->m_name_lookup;
  p_Var3 = (this->m_name_lookup).
           super__List_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_boost::system::error_code_&,_const_char_*)>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_boost::system::error_code_&,_const_char_*)>_>_>_>
           ._M_impl._M_node.super__List_node_base._M_next;
  if (p_Var3 != (_List_node_base *)this_00) {
    local_68._M_unused._M_object = (_List_node_base *)0x0;
    local_68._8_8_ = (_List_node_base *)0x0;
    local_58 = (_List_node_base *)0x0;
    local_50 = p_Var3[4]._M_prev;
    p_Var4 = p_Var3[4]._M_next;
    if (p_Var4 != (_List_node_base *)0x0) {
      local_68._M_unused._M_object = p_Var3[3]._M_next;
      local_68._8_8_ = p_Var3[3]._M_prev;
      p_Var3[4]._M_next = (_List_node_base *)0x0;
      p_Var3[4]._M_prev = (_List_node_base *)0x0;
      local_58 = p_Var4;
    }
    do_name_lookup<std::function<void(boost::system::error_code_const&,char_const*)>>
              (this,(string *)(p_Var3 + 1),
               (function<void_(const_boost::system::error_code_&,_const_char_*)> *)&local_68);
    if (local_58 != (_List_node_base *)0x0) {
      (*(code *)local_58)(&local_68,&local_68,__destroy_functor);
    }
    ::std::__cxx11::
    list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_boost::system::error_code_&,_const_char_*)>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_boost::system::error_code_&,_const_char_*)>_>_>_>
    ::_M_erase(this_00,(this_00->
                       super__List_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_boost::system::error_code_&,_const_char_*)>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_boost::system::error_code_&,_const_char_*)>_>_>_>
                       )._M_impl._M_node.super__List_node_base._M_next);
  }
  if (ec->failed_ == true) {
    pcVar5 = (code *)handler->_M_f;
    plVar6 = (long *)((long)&((handler->_M_bound_args).
                              super__Tuple_impl<0UL,_std::shared_ptr<libtorrent::aux::http_connection>,_std::_Placeholder<1>,_std::_Placeholder<2>_>
                              .
                              super__Head_base<0UL,_std::shared_ptr<libtorrent::aux::http_connection>,_false>
                              ._M_head_impl.
                              super___shared_ptr<libtorrent::aux::http_connection,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr)->_vptr_http_connection + *(long *)&handler->field_0x8);
    if (((ulong)pcVar5 & 1) != 0) {
      pcVar5 = *(code **)(pcVar5 + *plVar6 + -1);
    }
    (*pcVar5)(plVar6,ec,0);
  }
  else {
    pcVar5 = (code *)handler->_M_f;
    plVar6 = (long *)((long)&((handler->_M_bound_args).
                              super__Tuple_impl<0UL,_std::shared_ptr<libtorrent::aux::http_connection>,_std::_Placeholder<1>,_std::_Placeholder<2>_>
                              .
                              super__Head_base<0UL,_std::shared_ptr<libtorrent::aux::http_connection>,_false>
                              ._M_head_impl.
                              super___shared_ptr<libtorrent::aux::http_connection,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr)->_vptr_http_connection + *(long *)&handler->field_0x8);
    if (((ulong)pcVar5 & 1) != 0) {
      pcVar5 = *(code **)(pcVar5 + *plVar6 + -1);
    }
    (*pcVar5)(plVar6,ec,local_48[0]);
  }
  if (local_48[0] != local_38) {
    operator_delete(local_48[0],local_38[0] + 1);
  }
  return;
}

Assistant:

void on_name_lookup(error_code const& ec, std::shared_ptr<i2p_stream>, Handler handler)
	{
		m_state = sam_idle;

		std::string name = m_sam_socket->name_lookup();
		if (!m_name_lookup.empty())
		{
			std::pair<std::string, name_lookup_handler>& nl = m_name_lookup.front();
			do_name_lookup(nl.first, std::move(nl.second));
			m_name_lookup.pop_front();
		}

		if (ec)
		{
			handler(ec, nullptr);
			return;
		}

		handler(ec, name.c_str());
	}